

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

int __thiscall
Imf_3_2::TypedAttribute<Imf_3_2::Glorp>::copy
          (TypedAttribute<Imf_3_2::Glorp> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  TypedAttribute<Imf_3_2::Glorp> *this_00;
  
  this_00 = (TypedAttribute<Imf_3_2::Glorp> *)operator_new(0x10);
  *(undefined8 *)this_00 = 0;
  (this_00->_value).a = 0;
  (this_00->_value).b = 0;
  TypedAttribute(this_00);
  (**(code **)(*(long *)this_00 + 0x30))(this_00,this);
  return (int)this_00;
}

Assistant:

Attribute*
TypedAttribute<T>::copy () const
{
    Attribute* attribute = new TypedAttribute<T> ();
    attribute->copyValueFrom (*this);
    return attribute;
}